

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assign.cpp
# Opt level: O3

int main(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  object l_init;
  functor j_init;
  int b;
  fn a;
  undefined1 local_e0;
  undefined1 local_df;
  undefined1 local_de;
  undefined1 local_dd;
  undefined4 local_dc;
  undefined1 local_d8 [48];
  undefined1 local_a8 [16];
  code *local_98;
  undefined8 local_90;
  callable<int_(int),_32UL> local_88;
  
  local_88.m_empty = true;
  local_88.m_deleter = (deleter_function_pointer)0x0;
  local_88.m_caller = (caller_function_pointer)0x0;
  local_88.m_copier = (copier_function_pointer)0x0;
  local_88.m_mover = (mover_function_pointer)0x0;
  local_d8[0x20] = false;
  local_a8._8_8_ = functor::operator();
  local_98 = (code *)0x0;
  local_d8._0_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(functor&&)::{lambda(auto:1)#1}::
       callable_base<int,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(functor&&)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(functor&&)::{lambda(auto:1&,auto:2_const&)#1}
       ::callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(functor&&)::{lambda(auto:1&,auto:2&&)#1}::
       callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  local_d8[0x20] = false;
  local_a8._0_8_ = &local_dd;
  local_a8._8_8_ = functor::operator();
  local_98 = (code *)0x0;
  local_d8._0_8_ =
       tmf::callable<int(int),32ul>::callable<functor&>(functor&)::{lambda(auto:1)#1}::
       callable_base<int,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::callable<functor&>(functor&)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::callable<functor&>(functor&)::{lambda(auto:1&,auto:2_const&)#1}
       ::callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::callable<functor&>(functor&)::{lambda(auto:1&,auto:2&&)#1}::
       callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  local_d8[0x20] = false;
  local_a8._8_8_ = object::method;
  local_98 = (code *)0x0;
  local_d8._0_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(object&&,int(object::*)(int))::{lambda(auto:1)#1}::
       callable_base<int,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(object&&,int(object::*)(int))::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(object&&,int(object::*)(int))::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(object&&,int(object::*)(int))::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  local_d8[0x20] = false;
  local_a8._0_8_ = &local_de;
  local_a8._8_8_ = object::method;
  local_98 = (code *)0x0;
  local_d8._0_8_ =
       tmf::callable<int(int),32ul>::
       callable<object&,int(object::*)(int)>(object&,int(object::*)(int))::{lambda(auto:1)#1}::
       callable_base<int,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::
       callable<object&,int(object::*)(int)>(object&,int(object::*)(int))::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::
       callable<object&,int(object::*)(int)>(object&,int(object::*)(int))::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::
       callable<object&,int(object::*)(int)>(object&,int(object::*)(int))::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  local_d8[0x20] = false;
  local_a8._0_8_ = free_function;
  local_d8._0_8_ = (deleter_function_pointer)0x0;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::callable(int(*)(int))::{lambda(bool,auto:1,(auto:2)...)#1}::
       callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::callable(int(*)(int))::{lambda(auto:1&,auto:2_const&)#1}::
       callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::callable(int(*)(int))::{lambda(auto:1&,auto:2&&)#1}::
       callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  local_d8[0x20] = false;
  local_a8._0_8_ = object::static_method;
  local_d8._0_8_ = (deleter_function_pointer)0x0;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::callable(int(*)(int))::{lambda(bool,auto:1,(auto:2)...)#1}::
       callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::callable(int(*)(int))::{lambda(auto:1&,auto:2_const&)#1}::
       callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::callable(int(*)(int))::{lambda(auto:1&,auto:2&&)#1}::
       callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  local_d8[0x20] = false;
  local_a8._8_8_ =
       tmf::detail::
       member_function<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/assign.cpp:56:7),_int_((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/assign.cpp:56:7)::*)(int)_const,_int,_int>
       ::anon_class_1_0_00000001_for_m_object::operator();
  local_98 = (code *)0x0;
  local_d8._0_8_ =
       tmf::callable<int(int),32ul>::callable<main::$_0>(main::$_0&&)::{lambda(auto:1)#1}::
       callable_base<int,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::callable<main::$_0>(main::$_0&&)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::callable<main::$_0>(main::$_0&&)::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::callable<main::$_0>(main::$_0&&)::{lambda(auto:1&,auto:2&&)#1}
       ::callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  local_d8[0x20] = false;
  local_a8._0_8_ = main::anon_class_1_0_00000001::__invoke;
  local_d8._0_8_ = (deleter_function_pointer)0x0;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::callable(int(*)(int))::{lambda(bool,auto:1,(auto:2)...)#1}::
       callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::callable(int(*)(int))::{lambda(auto:1&,auto:2_const&)#1}::
       callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::callable(int(*)(int))::{lambda(auto:1&,auto:2&&)#1}::
       callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  local_a8._0_8_ = &local_dc;
  local_dc = 0x2a;
  local_d8[0x20] = false;
  local_a8._8_8_ =
       tmf::detail::
       member_function<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/assign.cpp:63:7),_int_((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tacticalmelonfarmer[P]handlebars/ext/callable/tests/assign.cpp:63:7)::*)(int)_const,_int,_int>
       ::anon_class_8_1_54a39802_for_m_object::operator();
  local_98 = (code *)0x0;
  local_d8._0_8_ =
       tmf::callable<int(int),32ul>::callable<main::$_2>(main::$_2&&)::{lambda(auto:1)#1}::
       callable_base<int,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::callable<main::$_2>(main::$_2&&)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::callable<main::$_2>(main::$_2&&)::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::callable<main::$_2>(main::$_2&&)::{lambda(auto:1&,auto:2&&)#1}
       ::callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  local_d8[0x20] = false;
  local_a8._0_8_ = &local_df;
  local_a8._8_8_ = functor::operator();
  local_98 = (code *)0x0;
  local_d8._0_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(functor*)::{lambda(auto:1)#1}::
       callable_base<int,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(functor*)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(functor*)::{lambda(auto:1&,auto:2_const&)#1}
       ::callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(functor*)::{lambda(auto:1&,auto:2&&)#1}::
       callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  local_d8[0x20] = false;
  local_a8._0_8_ = &local_e0;
  local_a8._8_8_ = object::method;
  local_98 = (code *)0x0;
  local_d8._0_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(object*,int(object::*)(int))::{lambda(auto:1)#1}::
       callable_base<int,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(object*,int(object::*)(int))::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(object*,int(object::*)(int))::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(object*,int(object::*)(int))::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int>___;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00103d00;
  local_a8._0_8_ = p_Var1 + 1;
  local_d8[0x20] = false;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var1->_M_use_count = 2;
  }
  local_98 = functor::operator();
  local_90 = 0;
  local_d8._0_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(std::shared_ptr<functor>&&)::
       {lambda(auto:1)#1}::callable_base<int,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(std::shared_ptr<functor>&&)::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(std::shared_ptr<functor>&&)::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::callable<functor>(std::shared_ptr<functor>&&)::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int>___;
  local_a8._8_8_ = p_Var1;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00103d78;
  local_a8._0_8_ = p_Var1 + 1;
  local_d8[0x20] = false;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var1->_M_use_count = 2;
  }
  local_98 = object::method;
  local_90 = 0;
  local_d8._0_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(std::shared_ptr<object>&&,int(object::*)(int))::
       {lambda(auto:1)#1}::callable_base<int,int>_const__;
  local_d8._8_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(std::shared_ptr<object>&&,int(object::*)(int))::
       {lambda(bool,auto:1,(auto:2)...)#1}::callable_base<int,int>_const__int_;
  local_d8._16_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(std::shared_ptr<object>&&,int(object::*)(int))::
       {lambda(auto:1&,auto:2_const&)#1}::callable_base<int,int>_const__;
  local_d8._24_8_ =
       tmf::callable<int(int),32ul>::
       callable<object,int(object::*)(int)>(std::shared_ptr<object>&&,int(object::*)(int))::
       {lambda(auto:1&,auto:2&&)#1}::callable_base<int,int>___;
  local_a8._8_8_ = p_Var1;
  tmf::callable<int_(int),_32UL>::operator=(&local_88,(callable<int_(int),_32UL> *)local_d8);
  tmf::callable<int_(int),_32UL>::~callable((callable<int_(int),_32UL> *)local_d8);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  tmf::callable<int_(int),_32UL>::~callable(&local_88);
  return 0;
}

Assistant:

int
main()
{
  using fn = tmf::callable<int(int)>;

  // default initialize an empty callable 'a'
  fn a{};

  // assign 'a' with a class with `int operator()(int)` defined
  // provide an rvalue to have your object possibly moved into the callable
		a = functor{};
  // you can provide an lvalue to have your instance copied into the callable
  functor functor_init{};
  a = functor_init;

  // to initialize with an arbitrary member function provide a class instance
  // and a pointer to member function
  // you can provide an rvalue to have your instance possibly moved into the
  // callable
  a = { object{}, &object::method };
  // you can provide an lvalue to have your instance copied into the callable
  object object_init{};
  a = { object_init, &object::method };

  // to initialize with a free function, provide the address of a
  // free function or static member function
  a = &free_function;
  a = &object::static_method;

  // to initialize with a lambda, simply provide the lambda
  a = [](int) { return 0; };

  // if the lambda can be downcast to a function pointer, this can reduce the storage requirements
  a = static_cast<int (*)(int)>([](int) { return 0; });

  // lambdas can capture, but keep in mind how this might effect the storage requirements
  int b = 42;
  a = [&b](int) { return b; };

  // assign a raw pointer to avoid copies and moves
  functor j_init;
  a = { &j_init };

  object l_init;
  a = { &l_init, &object::method };

  // shared_ptr is a safer way to avoid copies and moves
  a = { std::make_shared<functor>() };
  
  a = { std::make_shared<object>(), &object::method };

  return 0;
}